

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O3

void __thiscall cppforth::Forth::includeFile(Forth *this)

{
  CAddr CVar1;
  uint uVar2;
  Cell i;
  int iVar3;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  string fileContent;
  stringstream inStrStream;
  undefined1 local_208 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  long *local_1b8 [2];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  requireDStackDepth(this,1,"INCLUDE-FILE");
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"INCLUDE-FILE","");
  GetFileHandle((Forth *)local_208,(Cell)this,(string *)(ulong)uVar2,(errorCodes)local_1b8);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_local_buf[0] = '\0';
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::ostream::operator<<((ostream *)local_1a8,(streambuf *)(local_208._0_8_ + 0x18));
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_1f8,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  SaveInput(this);
  this->sourceid = uVar2;
  CVar1 = this->VarOffsetBlkAddress;
  iVar3 = 0;
  do {
    dataSpaceSet(this,CVar1 + iVar3,'\0');
    iVar3 = iVar3 + 1;
  } while (iVar3 != 4);
  SetInput(this,&local_1f8);
  this->InterpretState = InterpretSource;
  closeFile(this);
  ForthStack<unsigned_int>::pop(&this->dStack);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,
                    CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                             local_1f8.field_2._M_local_buf[0]) + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
  }
  return;
}

Assistant:

void includeFile() {
	REQUIRE_DSTACK_DEPTH(1, "INCLUDE-FILE");

	auto h = (dStack.getTop()); // do not delete handler from stack to close file after read
	auto f = GetFileHandle(h, "INCLUDE-FILE",errorReadFile);
	/*
	std::string line;
	while (std::getline(*f, line)) {
		auto addr = PutStringToEndOfDataSpace(line);
		push(CELL(addr));
		push(static_cast<Cell>(line.length()));
		evaluate(); //@bug - should move evaluate outside of this procedure
	}
	*/
	std::string fileContent{};
	std::stringstream inStrStream{};
	inStrStream << (*f).rdbuf();   // read the file
	fileContent = inStrStream.str(); //
	SaveInput();
	setSourceId(h);
	setDataCell(VarOffsetBlkAddress, Cell(0)); // set BLK=0
	SetInput(fileContent);
	InterpretState = InterpretSource;
	// must close file according to specification
	closeFile();
	pop(); // discard error code
}